

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListDelete(sqlite3 *db,ExprList *pList)

{
  ExprList_item *local_28;
  ExprList_item *pItem;
  int i;
  ExprList *pList_local;
  sqlite3 *db_local;
  
  if (pList != (ExprList *)0x0) {
    local_28 = pList->a;
    for (pItem._4_4_ = 0; pItem._4_4_ < pList->nExpr; pItem._4_4_ = pItem._4_4_ + 1) {
      sqlite3ExprDelete(db,local_28->pExpr);
      sqlite3DbFree(db,local_28->zName);
      sqlite3DbFree(db,local_28->zSpan);
      local_28 = local_28 + 1;
    }
    sqlite3DbFree(db,pList->a);
    sqlite3DbFree(db,pList);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListDelete(sqlite3 *db, ExprList *pList){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return;
  assert( pList->a!=0 || pList->nExpr==0 );
  for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
    sqlite3ExprDelete(db, pItem->pExpr);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zSpan);
  }
  sqlite3DbFree(db, pList->a);
  sqlite3DbFree(db, pList);
}